

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeString::findAndReplace
          (UnicodeString *this,int32_t start,int32_t length,UnicodeString *oldText,int32_t oldStart,
          int32_t oldLength,UnicodeString *newText,int32_t newStart,int32_t newLength)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int length_00;
  int32_t iVar4;
  int iVar5;
  int srcLength;
  int srcStart;
  int iVar6;
  int iVar7;
  int32_t start_00;
  char16_t *srcChars;
  int srcStart_00;
  int srcLength_00;
  int iVar8;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((((uVar1 & 1) == 0) &&
      (uVar2 = (oldText->fUnion).fStackFields.fLengthAndFlags, (uVar2 & 1) == 0)) &&
     (uVar3 = (newText->fUnion).fStackFields.fLengthAndFlags, (uVar3 & 1) == 0)) {
    if ((short)uVar2 < 0) {
      iVar4 = (oldText->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)(short)uVar2 >> 5;
    }
    iVar7 = oldStart;
    if (iVar4 < oldStart) {
      iVar7 = iVar4;
    }
    if (oldStart < 0) {
      iVar7 = 0;
    }
    iVar6 = iVar4 - iVar7;
    length_00 = oldLength;
    if (iVar6 < oldLength) {
      length_00 = iVar6;
    }
    if ((short)uVar3 < 0) {
      iVar8 = (newText->fUnion).fFields.fLength;
    }
    else {
      iVar8 = (int)(short)uVar3 >> 5;
    }
    srcStart_00 = newStart;
    if (iVar8 < newStart) {
      srcStart_00 = iVar8;
    }
    if (newStart < 0) {
      srcStart_00 = 0;
    }
    srcLength_00 = iVar8 - srcStart_00;
    if (newLength <= iVar8 - srcStart_00) {
      srcLength_00 = newLength;
    }
    if (newLength < 0) {
      srcLength_00 = 0;
    }
    if ((-1 < oldLength) && (length_00 != 0)) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      start_00 = start;
      if (iVar4 < start) {
        start_00 = iVar4;
      }
      if (start < 0) {
        start_00 = 0;
      }
      iVar8 = iVar4 - start_00;
      if (length <= iVar4 - start_00) {
        iVar8 = length;
      }
      if (length < 0) {
        iVar8 = 0;
      }
      for (; (0 < iVar8 && (length_00 <= iVar8)); iVar8 = (iVar8 - length_00) - iVar4) {
        uVar1 = (oldText->fUnion).fStackFields.fLengthAndFlags;
        iVar4 = -1;
        if ((uVar1 & 1) == 0) {
          if ((short)uVar1 < 0) {
            iVar5 = (oldText->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)(short)uVar1 >> 5;
          }
          srcStart = iVar7;
          if (iVar5 < iVar7) {
            srcStart = iVar5;
          }
          if (iVar7 < 0) {
            srcStart = 0;
          }
          srcLength = iVar5 - srcStart;
          if (length_00 <= iVar5 - srcStart) {
            srcLength = length_00;
          }
          if (iVar6 < 0) {
            srcLength = 0;
          }
          if (0 < srcLength) {
            srcChars = (oldText->fUnion).fStackFields.fBuffer;
            if ((uVar1 & 2) == 0) {
              srcChars = (oldText->fUnion).fFields.fArray;
            }
            iVar4 = indexOf(this,srcChars,srcStart,srcLength,start_00,iVar8);
          }
        }
        if (iVar4 < 0) {
          return this;
        }
        doReplace(this,iVar4,length_00,newText,srcStart_00,srcLength_00);
        iVar8 = iVar8 + start_00;
        start_00 = iVar4 + srcLength_00;
      }
    }
  }
  return this;
}

Assistant:

UnicodeString& 
UnicodeString::findAndReplace(int32_t start,
                  int32_t length,
                  const UnicodeString& oldText,
                  int32_t oldStart,
                  int32_t oldLength,
                  const UnicodeString& newText,
                  int32_t newStart,
                  int32_t newLength)
{
  if(isBogus() || oldText.isBogus() || newText.isBogus()) {
    return *this;
  }

  pinIndices(start, length);
  oldText.pinIndices(oldStart, oldLength);
  newText.pinIndices(newStart, newLength);

  if(oldLength == 0) {
    return *this;
  }

  while(length > 0 && length >= oldLength) {
    int32_t pos = indexOf(oldText, oldStart, oldLength, start, length);
    if(pos < 0) {
      // no more oldText's here: done
      break;
    } else {
      // we found oldText, replace it by newText and go beyond it
      replace(pos, oldLength, newText, newStart, newLength);
      length -= pos + oldLength - start;
      start = pos + newLength;
    }
  }

  return *this;
}